

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_decompress1X1_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int flags)

{
  undefined1 *puVar1;
  ushort uVar2;
  char cVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  ulong *puVar9;
  int iVar10;
  uint uVar11;
  ulong *puVar12;
  ulong uVar13;
  bool bVar14;
  ulong *local_38;
  
  if ((flags & 1U) != 0) {
    if (cSrcSize == 0) {
      cSrcSize = 0xffffffffffffffb8;
      uVar5 = 0;
      uVar13 = 0;
      puVar9 = (ulong *)0x0;
      cSrc = (ulong *)0x0;
      puVar12 = (ulong *)0x0;
    }
    else {
      puVar12 = (ulong *)((long)cSrc + 8);
      if (cSrcSize < 8) {
        uVar13 = (ulong)*cSrc;
        switch(cSrcSize) {
        case 7:
          uVar13 = uVar13 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
        case 6:
          uVar13 = uVar13 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
        case 5:
          uVar13 = uVar13 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
        case 4:
          uVar13 = uVar13 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
        case 3:
          uVar13 = uVar13 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
        case 2:
          uVar13 = uVar13 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
        default:
          bVar6 = *(byte *)((long)cSrc + (cSrcSize - 1));
          uVar4 = (uint)bVar6;
          if (bVar6 == 0) {
            cSrcSize = 0xffffffffffffffec;
          }
          else {
            uVar4 = (LZCOUNT((uint)bVar6) ^ 0xffffffe0U) + (int)cSrcSize * -8 + 0x49;
          }
          uVar5 = (ulong)uVar4;
          puVar9 = (ulong *)cSrc;
        }
      }
      else {
        puVar9 = (ulong *)((long)cSrc + (cSrcSize - 8));
        uVar13 = *puVar9;
        bVar6 = *(byte *)((long)cSrc + (cSrcSize - 1));
        uVar4 = (LZCOUNT((uint)bVar6) ^ 0xffffffe0U) + 9;
        if (bVar6 == 0) {
          uVar4 = (uint)bVar6;
        }
        uVar5 = (ulong)uVar4;
        cSrcSize = cSrcSize | -(ulong)(bVar6 == 0);
      }
    }
    if (0xffffffffffffff88 < cSrcSize) {
      return cSrcSize;
    }
    puVar1 = (undefined1 *)((long)dst + dstSize);
    uVar2 = *(ushort *)((long)DTable + 2);
    if (3 < (long)dstSize) {
      uVar4 = -(uint)uVar2 & 0x3f;
      do {
        uVar11 = (uint)uVar5;
        if (uVar11 < 0x41) {
          if (puVar9 < puVar12) {
            if (puVar9 == (ulong *)cSrc) goto LAB_001d93aa;
            bVar14 = cSrc <= (ulong *)((long)puVar9 - (uVar5 >> 3));
            uVar7 = (int)puVar9 - (int)cSrc;
            if (bVar14) {
              uVar7 = (uint)(uVar5 >> 3);
            }
            uVar11 = uVar11 + uVar7 * -8;
          }
          else {
            uVar7 = (uint)(uVar5 >> 3);
            uVar11 = uVar11 & 7;
            bVar14 = true;
          }
          uVar5 = (ulong)uVar11;
          puVar9 = (ulong *)((long)puVar9 - (ulong)uVar7);
          uVar13 = *puVar9;
        }
        else {
LAB_001d93aa:
          bVar14 = false;
        }
        if ((puVar1 + -3 <= dst) || (!bVar14)) goto LAB_001d94c9;
        uVar8 = (uVar13 << (uVar5 & 0x3f)) >> uVar4;
        uVar11 = (uint)*(byte *)((long)DTable + uVar8 * 2 + 4) + (int)uVar5;
        *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar8 * 2 + 5);
        uVar5 = (uVar13 << ((ulong)uVar11 & 0x3f)) >> uVar4;
        uVar11 = *(byte *)((long)DTable + uVar5 * 2 + 4) + uVar11;
        *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar5 * 2 + 5);
        uVar5 = (uVar13 << ((ulong)uVar11 & 0x3f)) >> uVar4;
        uVar11 = *(byte *)((long)DTable + uVar5 * 2 + 4) + uVar11;
        *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar5 * 2 + 5);
        uVar8 = (uVar13 << ((ulong)uVar11 & 0x3f)) >> uVar4;
        uVar5 = (ulong)(*(byte *)((long)DTable + uVar8 * 2 + 4) + uVar11);
        *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar8 * 2 + 5);
        dst = (void *)((long)dst + 4);
      } while( true );
    }
    uVar4 = (uint)uVar5;
    if (uVar4 < 0x41) {
      if (puVar9 < puVar12) {
        if (puVar9 == (ulong *)cSrc) goto LAB_001d94c9;
        uVar11 = (int)puVar9 - (int)cSrc;
        if (cSrc <= (ulong *)((long)puVar9 - (uVar5 >> 3))) {
          uVar11 = (uint)(uVar5 >> 3);
        }
        uVar4 = uVar4 + uVar11 * -8;
      }
      else {
        uVar11 = (uint)(uVar5 >> 3);
        uVar4 = uVar4 & 7;
      }
      uVar5 = (ulong)uVar4;
      puVar9 = (ulong *)((long)puVar9 - (ulong)uVar11);
      uVar13 = *puVar9;
    }
LAB_001d94c9:
    if (dst < puVar1) {
      do {
        uVar8 = (uVar13 << (uVar5 & 0x3f)) >> (-(uint)uVar2 & 0x3f);
        uVar4 = (uint)*(byte *)((long)DTable + uVar8 * 2 + 4) + (int)uVar5;
        *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar8 * 2 + 5);
        dst = (void *)((long)dst + 1);
        uVar5 = (ulong)uVar4;
      } while (dst < puVar1);
    }
    else {
      uVar4 = (uint)uVar5;
    }
    if (uVar4 != 0x40) {
      dstSize = 0xffffffffffffffec;
    }
    if (puVar9 != (ulong *)cSrc) {
      dstSize = 0xffffffffffffffec;
    }
    return dstSize;
  }
  if (cSrcSize == 0) {
    cSrcSize = 0xffffffffffffffb8;
    uVar5 = 0;
    uVar13 = 0;
    puVar12 = (ulong *)0x0;
    cSrc = (ulong *)0x0;
    local_38 = (ulong *)0x0;
  }
  else {
    local_38 = (ulong *)((long)cSrc + 8);
    if (cSrcSize < 8) {
      uVar13 = (ulong)*cSrc;
      switch(cSrcSize) {
      case 7:
        uVar13 = uVar13 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
      case 6:
        uVar13 = uVar13 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
      case 5:
        uVar13 = uVar13 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
      case 4:
        uVar13 = uVar13 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
      case 3:
        uVar13 = uVar13 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
      case 2:
        uVar13 = uVar13 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
      default:
        bVar6 = *(byte *)((long)cSrc + (cSrcSize - 1));
        uVar4 = 0x1f;
        if (bVar6 != 0) {
          for (; bVar6 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        if (bVar6 == 0) {
          cSrcSize = 0xffffffffffffffec;
          uVar4 = 0;
        }
        else {
          uVar4 = ~uVar4 + (int)cSrcSize * -8 + 0x49;
        }
        uVar5 = (ulong)uVar4;
        puVar12 = (ulong *)cSrc;
      }
    }
    else {
      puVar12 = (ulong *)((long)cSrc + (cSrcSize - 8));
      uVar13 = *puVar12;
      bVar6 = *(byte *)((long)cSrc + (cSrcSize - 1));
      uVar4 = 0x1f;
      if (bVar6 != 0) {
        for (; bVar6 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar4 = ~uVar4 + 9;
      if (bVar6 == 0) {
        uVar4 = 0;
      }
      uVar5 = (ulong)uVar4;
      cSrcSize = cSrcSize | -(ulong)(bVar6 == 0);
    }
  }
  if (0xffffffffffffff88 < cSrcSize) {
    return cSrcSize;
  }
  puVar1 = (undefined1 *)((long)dst + dstSize);
  cVar3 = (char)*(undefined2 *)((long)DTable + 2);
  if (3 < (long)dstSize) {
    bVar6 = -cVar3 & 0x3f;
    do {
      uVar4 = (uint)uVar5;
      if (uVar4 < 0x41) {
        if (puVar12 < local_38) {
          if (puVar12 == (ulong *)cSrc) goto LAB_0019296e;
          bVar14 = cSrc <= (ulong *)((long)puVar12 - (uVar5 >> 3));
          uVar11 = (int)puVar12 - (int)cSrc;
          if (bVar14) {
            uVar11 = (uint)(uVar5 >> 3);
          }
          uVar4 = uVar4 + uVar11 * -8;
        }
        else {
          uVar11 = (uint)(uVar5 >> 3);
          uVar4 = uVar4 & 7;
          bVar14 = true;
        }
        uVar5 = (ulong)uVar4;
        puVar12 = (ulong *)((long)puVar12 - (ulong)uVar11);
        uVar13 = *puVar12;
      }
      else {
LAB_0019296e:
        bVar14 = false;
      }
      if ((puVar1 + -3 <= dst) || (!bVar14)) goto LAB_00192a98;
      uVar8 = (uVar13 << ((byte)uVar5 & 0x3f)) >> bVar6;
      iVar10 = (uint)*(byte *)((long)DTable + uVar8 * 2 + 4) + (int)uVar5;
      uVar5 = (uVar13 << ((byte)iVar10 & 0x3f)) >> bVar6;
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar8 * 2 + 5);
      iVar10 = (uint)*(byte *)((long)DTable + uVar5 * 2 + 4) + iVar10;
      uVar8 = (uVar13 << ((byte)iVar10 & 0x3f)) >> bVar6;
      *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar5 * 2 + 5);
      iVar10 = (uint)*(byte *)((long)DTable + uVar8 * 2 + 4) + iVar10;
      *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar8 * 2 + 5);
      uVar8 = (uVar13 << ((byte)iVar10 & 0x3f)) >> bVar6;
      uVar5 = (ulong)((uint)*(byte *)((long)DTable + uVar8 * 2 + 4) + iVar10);
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar8 * 2 + 5);
      dst = (void *)((long)dst + 4);
    } while( true );
  }
  uVar4 = (uint)uVar5;
  if (uVar4 < 0x41) {
    if (puVar12 < local_38) {
      if (puVar12 == (ulong *)cSrc) goto LAB_00192a98;
      uVar11 = (int)puVar12 - (int)cSrc;
      if (cSrc <= (ulong *)((long)puVar12 - (uVar5 >> 3))) {
        uVar11 = (uint)(uVar5 >> 3);
      }
      uVar4 = uVar4 + uVar11 * -8;
    }
    else {
      uVar11 = (uint)(uVar5 >> 3);
      uVar4 = uVar4 & 7;
    }
    uVar5 = (ulong)uVar4;
    puVar12 = (ulong *)((long)puVar12 - (ulong)uVar11);
    uVar13 = *puVar12;
  }
LAB_00192a98:
  uVar4 = (uint)uVar5;
  if (dst < puVar1) {
    do {
      uVar8 = (uVar13 << ((byte)uVar5 & 0x3f)) >> (-cVar3 & 0x3fU);
      uVar4 = (int)uVar5 + (uint)*(byte *)((long)DTable + uVar8 * 2 + 4);
      uVar5 = (ulong)uVar4;
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar8 * 2 + 5);
      dst = (void *)((long)dst + 1);
    } while (dst < puVar1);
  }
  if (uVar4 != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (puVar12 != (ulong *)cSrc) {
    dstSize = 0xffffffffffffffec;
  }
  return dstSize;
}

Assistant:

HUF_DGEN(HUF_decompress1X1_usingDTable_internal)

static size_t HUF_decompress4X1_usingDTable_internal(void* dst, size_t dstSize, void const* cSrc,
                    size_t cSrcSize, HUF_DTable const* DTable, int flags)
{
    HUF_DecompressUsingDTableFn fallbackFn = HUF_decompress4X1_usingDTable_internal_default;
    HUF_DecompressFastLoopFn loopFn = HUF_decompress4X1_usingDTable_internal_fast_c_loop;

#if DYNAMIC_BMI2
    if (flags & HUF_flags_bmi2) {
        fallbackFn = HUF_decompress4X1_usingDTable_internal_bmi2;
# if ZSTD_ENABLE_ASM_X86_64_BMI2
        if (!(flags & HUF_flags_disableAsm)) {
            loopFn = HUF_decompress4X1_usingDTable_internal_fast_asm_loop;
        }
# endif
    } else {
        return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
    }
#endif

#if ZSTD_ENABLE_ASM_X86_64_BMI2 && defined(__BMI2__)
    if (!(flags & HUF_flags_disableAsm)) {
        loopFn = HUF_decompress4X1_usingDTable_internal_fast_asm_loop;
    }
#endif

    if (!(flags & HUF_flags_disableFast)) {
        size_t const ret = HUF_decompress4X1_usingDTable_internal_fast(dst, dstSize, cSrc, cSrcSize, DTable, loopFn);
        if (ret != 0)
            return ret;
    }
    return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
}